

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O3

int ORPG::Core::getopt_internal(int argc,char **argv,char *options)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = optreset;
  while( true ) {
    iVar4 = optind;
    if (iVar5 == 0) {
      cVar2 = *getopt_internal::place;
      if (cVar2 != '\0') goto LAB_00102607;
    }
    else {
      nonopt_end = -1;
      nonopt_start = -1;
    }
    optreset = 0;
    if (argc <= optind) {
      getopt_internal::place = "";
      if (nonopt_end == -1) {
        if (nonopt_start == -1) {
          nonopt_end = 0xffffffff;
          nonopt_start = 0xffffffff;
          optreset = 0;
          return -1;
        }
      }
      else {
        permute_args(nonopt_start,nonopt_end,optind,argv);
        nonopt_start = (nonopt_start - nonopt_end) + optind;
      }
      optind = nonopt_start;
      nonopt_end = 0xffffffff;
      nonopt_start = 0xffffffff;
      return -1;
    }
    pcVar3 = argv[optind];
    if ((*pcVar3 == '-') &&
       ((cVar2 = pcVar3[1], cVar2 != '\0' || (pcVar1 = strchr(options,0x2d), pcVar1 != (char *)0x0))
       )) break;
    getopt_internal::place = "";
    if (nonopt_start == -1) {
      nonopt_start = iVar4;
LAB_001024e5:
      iVar5 = 0;
    }
    else {
      if (nonopt_end == -1) goto LAB_001024e5;
      permute_args(nonopt_start,nonopt_end,iVar4,argv);
      nonopt_start = nonopt_start + (optind - nonopt_end);
      nonopt_end = -1;
      iVar5 = optreset;
      iVar4 = optind;
    }
    optind = iVar4 + 1;
  }
  if (nonopt_end == -1 && nonopt_start != -1) {
    nonopt_end = iVar4;
  }
  getopt_internal::place = pcVar3;
  if (((cVar2 != '\0') && (getopt_internal::place = pcVar3 + 1, cVar2 == '-')) &&
     (pcVar3[2] == '\0')) {
    optind = iVar4 + 1;
    getopt_internal::place = "";
    if (nonopt_end != -1) {
      permute_args(nonopt_start,nonopt_end,optind,argv);
      optind = optind + (nonopt_start - nonopt_end);
    }
    nonopt_end = 0xffffffff;
    nonopt_start = 0xffffffff;
    return -1;
  }
  if (getopt_internal::place[1] != '\0') {
    if (*getopt_internal::place == '-') {
      getopt_internal::place = "";
      return -2;
    }
    getopt_internal::place = getopt_internal::place + 1;
  }
  cVar2 = *getopt_internal::place;
LAB_00102607:
  pcVar3 = getopt_internal::place + 1;
  iVar5 = (int)cVar2;
  getopt_internal::place = pcVar3;
  optopt = iVar5;
  if (cVar2 != ':') {
    pcVar1 = strchr(options,iVar5);
    if (pcVar1 != (char *)0x0) {
      if (pcVar1[1] != ':') {
        if (*pcVar3 == '\0') {
          optind = optind + 1;
          optarg = (char *)0x0;
          return iVar5;
        }
        optarg = (char *)0x0;
        return iVar5;
      }
      if (*pcVar3 == '\0') {
        iVar4 = optind + 1;
        if (argc <= iVar4) {
          getopt_internal::place = "";
          if (opterr == 0) {
            optind = iVar4;
            return 0x3a;
          }
          if (*options != ':') {
            optind = iVar4;
            getopt_internal();
            return 0x3a;
          }
          optind = iVar4;
          return 0x3a;
        }
        pcVar3 = argv[(long)optind + 1];
        optind = iVar4;
      }
      getopt_internal::place = "";
      optind = optind + 1;
      optarg = pcVar3;
      return iVar5;
    }
    if (cVar2 == '-') {
      return -1;
    }
  }
  if (*pcVar3 == '\0') {
    optind = optind + 1;
  }
  if ((opterr != 0) && (*options != ':')) {
    getopt_internal();
  }
  return 0x3f;
}

Assistant:

int getopt_internal(int argc,
                            char* argv[],
                            const char *options) {
            /* option letter processing */
            static char* place = EMPTY;

            /* option letter list index */
            char* olli;

            /* reset our non-option start and end positions */
            if (optreset)
                nonopt_start = nonopt_end = -1;

            /* update scanning pointer */
            if (optreset || !*place) {
                optreset = 0;

                /* end of argument array */
                if (optind >= argc) {
                    place = EMPTY;

                    if (nonopt_end != -1) {
                        /* do permutation, if we have to
                        TODO: get this working!! */
                        permute_args(nonopt_start, nonopt_end, optind, argv);

                        optind -= nonopt_end - nonopt_start;
                    } else if (nonopt_start != -1) {
                        /* If we skipped non-options, set optind
                        to the first of them. */
                        optind = nonopt_start;
                    }

                    nonopt_start = nonopt_end = -1;

                    return EOF;
                }

                /* check if this is a non-option */
                if(*(place = argv[optind]) != OP_DELIM ||
                (place[1] == '\0' && strchr(options, '-') == NULL)) {
                    place = EMPTY;

                    /* if we found the first non-argument set, then start there
                    otherwise if we found the last non-argument then do a
                    permutation

                    TODO: Get this working!!! */
                    if (nonopt_start == -1)
                        nonopt_start = optind;
                    else if (nonopt_end != -1) {
                        permute_args(nonopt_start, nonopt_end, optind, argv);

                        nonopt_start = optind - (nonopt_end - nonopt_start);
                        nonopt_end = -1;
                    }

                    optind++;

                    return getopt_internal(argc, argv, options);
                }

                if (nonopt_start != -1 && nonopt_end == -1)
                    nonopt_end = optind;

                /* If we have "-" do nothing, if "--" we are done */
                if (place[1] != '\0' && *++place == '-' && place[1] == '\0') {
                    optind++;
                    place = EMPTY;
                    /* We found a long option (--), so if we skipped
                    non-options, we have to permute. */
                    if (nonopt_end != -1) {
                        permute_args(nonopt_start, nonopt_end, optind, argv);
                        optind -= nonopt_end - nonopt_start;
                    }

                    nonopt_start = nonopt_end = -1;

                    return -1;
                }

                /* found "--" */
                if (place[1] && *place++ == OP_DELIM) {
                    /* ++optind; */
                    place = EMPTY;

                    return CONTINUE_CODE;
                }
            }

            /* option letter okay? */
            if ((optopt = (int)*place++) == BADARG ||
                !(olli = (char *)strchr(options, optopt))) {
                /*
                * if the user didn't specify OP_DELIM as an option,
                * assume it means EOF.
                */
                if (optopt == (int)OP_DELIM)
                    return EOF;
                if (!*place)
                    ++optind;
                if (opterr && *options != ':')
                    (void)fprintf(stderr,
                                "%s: illegal option -- %c%s\n",
                                program_name(argv[0]), optopt, place);

                return BADCHAR;
            }
            if (*++olli != ':') {
                /* don't need argument */
                optarg = NULL;
                if (!*place)
                    ++optind;
            } else {
                /* need an argument */

                /* no white space */
                if (*place)
                    optarg = place;
                /* no arg */
                else if (argc <= ++optind) {
                    place = EMPTY;
                    if ((opterr) && (*options != ':'))
                        (void)fprintf(stderr,
                                    "%s: option requires an argument -- %c\n",
                                    program_name(argv[0]), optopt);
                    return BADARG;
                } else
                    /* white space */
                    optarg = argv[optind];

                place = EMPTY;
                ++optind;
            }

            /* dump back option letter */
            return optopt;
        }